

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int luaV_lessthan(lua_State *L,TValue *l,TValue *r)

{
  int iVar1;
  int res;
  TValue *r_local;
  TValue *l_local;
  lua_State *L_local;
  
  if (((l->tt_ & 0xfU) == 3) && ((r->tt_ & 0xfU) == 3)) {
    L_local._4_4_ = LTnum(l,r);
  }
  else if (((l->tt_ & 0xfU) == 4) && ((r->tt_ & 0xfU) == 4)) {
    iVar1 = l_strcmp((TString *)(l->value_).gc,(TString *)(r->value_).gc);
    L_local._4_4_ = (uint)(iVar1 < 0);
  }
  else {
    L_local._4_4_ = luaT_callorderTM(L,l,r,TM_LT);
    if ((int)L_local._4_4_ < 0) {
      luaG_ordererror(L,l,r);
    }
  }
  return L_local._4_4_;
}

Assistant:

int luaV_lessthan(lua_State *L, const TValue *l, const TValue *r) {
    int res;
    if (ttisnumber(l) && ttisnumber(r))  /* both operands are numbers? */
        return LTnum(l, r);
    else if (ttisstring(l) && ttisstring(r))  /* both are strings? */
        return l_strcmp(tsvalue(l), tsvalue(r)) < 0;
    else if ((res = luaT_callorderTM(L, l, r, TM_LT)) < 0)  /* no metamethod? */
        luaG_ordererror(L, l, r);  /* error */
    return res;
}